

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effective_info.c
# Opt level: O1

double inform_effective_info(double *tpm,double *inter,size_t n,inform_error *err)

{
  double *pdVar1;
  double dVar2;
  size_t i_1;
  void *__ptr;
  long lVar3;
  long lVar4;
  double *pdVar5;
  size_t i_2;
  size_t sVar6;
  long lVar7;
  long lVar8;
  double *sf;
  bool bVar9;
  double sum_1;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double sum;
  double dVar13;
  double local_58;
  
  if (tpm == (double *)0x0) {
    local_58 = NAN;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETPM;
    }
  }
  else if (n == 0) {
    local_58 = NAN;
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESIZE;
    }
  }
  else {
    lVar8 = n * n;
    pdVar1 = tpm + lVar8;
    bVar9 = 0 < lVar8;
    pdVar5 = tpm;
    if (0 < lVar8) {
      do {
        sVar6 = 0;
        dVar13 = 0.0;
        do {
          if (pdVar5[sVar6] < 0.0) {
            dVar13 = NAN;
            break;
          }
          dVar13 = dVar13 + pdVar5[sVar6];
          sVar6 = sVar6 + 1;
        } while (n != sVar6);
        if ((NAN(dVar13)) || (1e-06 < ABS(dVar13 + -1.0))) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_ETPM;
          }
          if (bVar9) {
            return NAN;
          }
          break;
        }
        bVar9 = pdVar5 + n < pdVar1;
        pdVar5 = pdVar5 + n;
      } while (bVar9);
    }
    if (inter != (double *)0x0) {
      sVar6 = 0;
      dVar13 = 0.0;
      do {
        if (inter[sVar6] < 0.0) {
          dVar13 = NAN;
          break;
        }
        dVar13 = dVar13 + inter[sVar6];
        sVar6 = sVar6 + 1;
      } while (n != sVar6);
      if ((NAN(dVar13)) || (1e-06 < ABS(dVar13 + -1.0))) {
        if (err == (inform_error *)0x0) {
          return NAN;
        }
        *err = INFORM_EDIST;
        return NAN;
      }
    }
    __ptr = calloc(n * 2,8);
    if (__ptr == (void *)0x0) {
      local_58 = NAN;
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      if (inter == (double *)0x0) {
        auVar11._8_4_ = (int)(n >> 0x20);
        auVar11._0_8_ = n;
        auVar11._12_4_ = 0x45300000;
        inter = (double *)(n * 8 + (long)__ptr);
        lVar3 = 0;
        do {
          inter[lVar3] = 1.0 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0));
          lVar3 = lVar3 + 1;
        } while (n + (n == 0) != lVar3);
      }
      lVar3 = n + (n == 0);
      lVar4 = 0;
      pdVar5 = tpm;
      do {
        lVar7 = 0;
        do {
          *(double *)((long)__ptr + lVar7 * 8) =
               inter[lVar4] * pdVar5[lVar7] + *(double *)((long)__ptr + lVar7 * 8);
          lVar7 = lVar7 + 1;
        } while (lVar3 != lVar7);
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + n;
      } while (lVar4 != lVar3);
      if (lVar8 == 0) {
        local_58 = 0.0;
      }
      else {
        local_58 = 0.0;
        do {
          dVar13 = *inter;
          sVar6 = 0;
          dVar12 = 0.0;
          do {
            dVar2 = tpm[sVar6];
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              dVar10 = log2(dVar2 / *(double *)((long)__ptr + sVar6 * 8));
              dVar12 = dVar12 + dVar10 * dVar2;
            }
            sVar6 = sVar6 + 1;
          } while (n != sVar6);
          local_58 = local_58 + dVar13 * dVar12;
          tpm = tpm + n;
          inter = inter + 1;
        } while (tpm != pdVar1);
      }
      free(__ptr);
    }
  }
  return local_58;
}

Assistant:

double inform_effective_info(double const *tpm, double const *inter, size_t n,
    inform_error *err)
{
    if (check_arguments(tpm, inter, n, err))
    {
        return NAN;
    }

    // allocate enough memory for the ID and ED distributions
    double *data = calloc(2 * n, sizeof(double));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    // set the ID and ED pointers to pointer the right places
    double *ed = data;
    double const *id;
    if (inter != NULL)
    {
        id = inter;
    }
    else
    {
        // make the ID distribution uniform
        double const k = 1.0 / n;
        for (size_t i = 0; i < n; ++i) data[i + n] = k;
        id = (double const *) data + n;
    }

    // compute the ED given the ID and TPM
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < n; ++j)
        {
            ed[j] += id[i] * tpm[j + i*n];
        }
    }

    // and comput the effective information
    double ei = 0.0;
    for (double const *sf = tpm; sf != tpm + n*n; sf += n, ++id)
    {
        ei += (*id) * kldivergence(sf, ed, n);
    }

    free(data);

    return ei;
}